

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O2

string * __thiscall
DebugInfo::GetObjectFileDesc_abi_cxx11_(string *__return_storage_ptr__,DebugInfo *this,int index)

{
  pointer pOVar1;
  const_iterator cVar2;
  string *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pOVar1 = (this->m_ObjectFiles).super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __k = &pOVar1[index].fileName;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&(this->m_ObjectNameToFolders)._M_t,__k);
  if (((_Rb_tree_header *)cVar2._M_node ==
       &(this->m_ObjectNameToFolders)._M_t._M_impl.super__Rb_tree_header) ||
     (cVar2._M_node[3]._M_parent < (_Base_ptr)0x2)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__k);
  }
  else {
    std::operator+(&local_48,__k," (");
    std::operator+(&bStack_68,&local_48,&pOVar1[index].fileDir);
    std::operator+(__return_storage_ptr__,&bStack_68,")");
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DebugInfo::GetObjectFileDesc(int index) const
{
    const ObjectFileInfo& info = m_ObjectFiles[index];
    const auto it = m_ObjectNameToFolders.find(info.fileName);
    if (it == m_ObjectNameToFolders.end() || it->second.size() < 2)
        return info.fileName;
    return info.fileName + " (" + info.fileDir + ")";
}